

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O3

QVariant * __thiscall
QAssociativeIterable::value
          (QVariant *__return_storage_ptr__,QAssociativeIterable *this,QVariant *key)

{
  ulong uVar1;
  bool bVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  QMetaType local_60;
  QMetaType local_58;
  QMetaContainer local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d_ptr =
       (this->super_QIterable<QMetaAssociation>).m_metaContainer.super_QMetaContainer.d_ptr;
  local_58 = QMetaAssociation::mappedMetaType((QMetaAssociation *)&local_50);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
  local_60 = QMetaAssociation::keyMetaType((QMetaAssociation *)&local_50);
  pvVar3 = QtPrivate::QVariantTypeCoercer::coerce((QVariantTypeCoercer *)&local_48,key,&local_60);
  local_60.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
  bVar2 = ::comparesEqual(&local_58,&local_60);
  if (bVar2) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    if ((local_50.d_ptr != (QMetaContainerInterface *)0x0) &&
       (local_50.d_ptr[1].compareIteratorFn != (CompareIteratorFn)0x0)) {
      (*local_50.d_ptr[1].compareIteratorFn)
                ((void *)((this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d &
                         0xfffffffffffffffe),pvVar3);
    }
  }
  else {
    *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(__return_storage_ptr__,local_58,(void *)0x0);
    uVar1 = (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d;
    ::QVariant::data(__return_storage_ptr__);
    if ((local_50.d_ptr != (QMetaContainerInterface *)0x0) &&
       (local_50.d_ptr[1].compareIteratorFn != (CompareIteratorFn)0x0)) {
      (*local_50.d_ptr[1].compareIteratorFn)((void *)(uVar1 & 0xfffffffffffffffe),pvVar3);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAssociativeIterable::value(const QVariant &key) const
{
    const QMetaAssociation meta = metaContainer();
    const QMetaType mappedMetaType = meta.mappedMetaType();

    QtPrivate::QVariantTypeCoercer coercer;
    const void *keyData = coercer.coerce(key, meta.keyMetaType());

    if (mappedMetaType == QMetaType::fromType<QVariant>()) {
        QVariant result;
        meta.mappedAtKey(constIterable(), keyData, &result);
        return result;
    }

    QVariant result(mappedMetaType);
    meta.mappedAtKey(constIterable(), keyData, result.data());
    return result;
}